

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

iterator __thiscall
phmap::priv::
btree<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
::insert_multi<std::pair<int,int>const&>
          (btree<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
           *this,key_type *key,pair<int,_int> *v)

{
  node_type *pnVar1;
  iterator iVar2;
  
  if (*(long *)(this + 0x10) == 0) {
    pnVar1 = btree<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
             ::new_leaf_root_node
                       ((btree<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                         *)this,1);
    *(node_type **)(this + 8) = pnVar1;
    *(node_type **)this = pnVar1;
  }
  iVar2 = btree<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
          ::internal_upper_bound<int>
                    ((btree<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                      *)this,key);
  if (iVar2.node ==
      (btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
       *)0x0) {
    iVar2 = btree<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
            ::end((btree<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                   *)this);
  }
  iVar2 = internal_emplace<std::pair<int,int>const&>(this,iVar2,v);
  return iVar2;
}

Assistant:

auto btree<P>::insert_multi(const key_type &key, ValueType &&v) -> iterator {
        if (empty()) {
            mutable_root() = rightmost_ = new_leaf_root_node(1);
        }

        iterator iter = internal_upper_bound(key);
        if (iter.node == nullptr) {
            iter = end();
        }
        return internal_emplace(iter, std::forward<ValueType>(v));
    }